

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

bool __thiscall
c4::yml::Parser::_filter_nl<false,false>
          (Parser *this,substr r,size_t *i,size_t *pos,size_t indentation)

{
  code *pcVar1;
  long lVar2;
  long lVar3;
  ro_substr chars;
  csubstr r_00;
  bool bVar4;
  error_flags eVar5;
  size_t sVar6;
  ulong *in_RCX;
  ulong in_RDX;
  long in_RSI;
  size_t in_RDI;
  long *in_R8;
  long in_R9;
  size_t j;
  size_t numnl_following;
  size_t ii;
  char msg_1 [29];
  char msg [36];
  bool replaced;
  char curr;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  char *in_stack_fffffffffffffe98;
  Location *in_stack_fffffffffffffea0;
  Location *this_00;
  undefined1 *in_stack_fffffffffffffeb0;
  basic_substring<char> *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec7;
  basic_substring<char_const> local_128 [16];
  ulong local_118;
  ro_substr local_110;
  size_t local_100;
  ulong indentation_00;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  Location local_c8;
  undefined4 uStack_98;
  undefined4 uStack_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  char *local_80;
  undefined1 local_78 [38];
  byte local_52;
  char local_51;
  long local_50;
  long *local_48;
  ulong *local_40;
  long local_30;
  ulong local_28;
  char *local_20;
  undefined4 local_18;
  ulong local_10;
  long *local_8;
  
  local_10 = *in_RCX;
  local_8 = &local_30;
  local_50 = in_R9;
  local_48 = in_R8;
  local_40 = in_RCX;
  local_30 = in_RSI;
  local_28 = in_RDX;
  if (in_RDX <= local_10) {
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) &&
       (in_stack_fffffffffffffec7 = is_debugger_attached(), (bool)in_stack_fffffffffffffec7)) {
      trap_instruction();
    }
    local_20 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_18 = 0x14c3;
    handle_error(0x3f0daf,(char *)0x14c3,"check failed: %s","i >= 0 && i < len");
  }
  local_51 = *(char *)(local_30 + local_10);
  local_52 = 0;
  if (local_50 == -1) {
    memcpy(local_78,"check failed: (indentation != npos)",0x24);
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    in_stack_fffffffffffffeb8 = *(basic_substring<char> **)(in_RDI + 0x9e8);
    in_stack_fffffffffffffeb0 = local_78;
    Location::Location(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    (*(code *)in_stack_fffffffffffffeb8)
              (in_stack_fffffffffffffeb0,0x24,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffe80 = uStack_98;
    in_stack_fffffffffffffe84 = uStack_94;
    in_stack_fffffffffffffe88 = local_90;
    in_stack_fffffffffffffe8c = uStack_8c;
    in_stack_fffffffffffffe90 = uStack_88;
    in_stack_fffffffffffffe94 = uStack_84;
    in_stack_fffffffffffffe98 = local_80;
  }
  if (local_51 != '\n') {
    local_c8.super_LineCol.offset._0_1_ = 'c';
    local_c8.super_LineCol.offset._1_1_ = 'h';
    local_c8.super_LineCol.offset._2_1_ = 'e';
    local_c8.super_LineCol.offset._3_1_ = 'c';
    local_c8.super_LineCol.offset._4_1_ = 'k';
    local_c8.super_LineCol.offset._5_1_ = ' ';
    local_c8.super_LineCol.offset._6_1_ = 'f';
    local_c8.super_LineCol.offset._7_1_ = 'a';
    local_c8.super_LineCol.line._0_1_ = 'i';
    local_c8.super_LineCol.line._1_1_ = 'l';
    local_c8.super_LineCol.line._2_1_ = 'e';
    local_c8.super_LineCol.line._3_1_ = 'd';
    local_c8.super_LineCol.line._4_1_ = ':';
    local_c8.super_LineCol.line._5_1_ = ' ';
    local_c8.super_LineCol.line._6_1_ = '(';
    local_c8.super_LineCol.line._7_1_ = 'c';
    local_c8.super_LineCol.col._0_1_ = 'u';
    local_c8.super_LineCol.col._1_1_ = 'r';
    local_c8.super_LineCol.col._2_1_ = 'r';
    local_c8.super_LineCol.col._3_1_ = ' ';
    local_c8.super_LineCol.col._4_1_ = '=';
    local_c8.super_LineCol.col._5_1_ = '=';
    local_c8.super_LineCol.col._6_1_ = ' ';
    local_c8.super_LineCol.col._7_1_ = '\'';
    local_c8.name.str._0_4_ = 0x29276e5c;
    local_c8.name.str._4_1_ = 0;
    eVar5 = get_error_flags();
    if (((eVar5 & 1) != 0) && (bVar4 = is_debugger_attached(), bVar4)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    this_00 = &local_c8;
    Location::Location(this_00,in_stack_fffffffffffffe98,
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                       CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    (*pcVar1)(this_00,0x1d,*(undefined8 *)(in_RDI + 0x9d0));
  }
  indentation_00 = *local_40;
  local_110 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3d41d8);
  r_00.str._4_4_ = in_stack_ffffffffffffff1c;
  r_00.str._0_4_ = in_stack_ffffffffffffff18;
  r_00.len._0_4_ = in_stack_ffffffffffffff20;
  r_00.len._4_4_ = in_stack_ffffffffffffff24;
  local_100 = anon_unknown_0::count_following_newlines
                        (r_00,(size_t *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         indentation_00);
  if (local_100 == 0) {
    basic_substring<char_const>::basic_substring<3ul>(local_128,(char (*) [3])" \t");
    chars.str._7_1_ = in_stack_fffffffffffffec7;
    chars.str._0_7_ = in_stack_fffffffffffffec0;
    chars.len = in_RDI;
    sVar6 = basic_substring<char>::first_not_of
                      (in_stack_fffffffffffffeb8,chars,(size_t)in_stack_fffffffffffffeb0);
    if (sVar6 == 0xffffffffffffffff) {
      *local_40 = local_28;
    }
    else {
      lVar2 = *(long *)(in_RDI + 0xa78);
      lVar3 = *local_48;
      *local_48 = lVar3 + 1;
      *(undefined1 *)(lVar2 + lVar3) = 0x20;
      local_52 = 1;
    }
  }
  else {
    for (local_118 = 0; local_118 < local_100; local_118 = local_118 + 1) {
      lVar2 = *(long *)(in_RDI + 0xa78);
      lVar3 = *local_48;
      *local_48 = lVar3 + 1;
      *(undefined1 *)(lVar2 + lVar3) = 10;
    }
  }
  *local_40 = indentation_00 - 1;
  return (bool)(local_52 & 1);
}

Assistant:

bool Parser::_filter_nl(substr r, size_t *C4_RESTRICT i, size_t *C4_RESTRICT pos, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfnl(fmt, ...) _c4dbgpf("filter_nl[{}]: " fmt, *i, __VA_ARGS__)
    #else
    #define _c4dbgfnl(...)
    #endif

    const char curr = r[*i];
    bool replaced = false;

    _RYML_CB_ASSERT(m_stack.m_callbacks, indentation != npos);
    _RYML_CB_ASSERT(m_stack.m_callbacks, curr == '\n');

    _c4dbgfnl("found newline. sofar=[{}]~~~{}~~~", *pos, m_filter_arena.first(*pos));
    size_t ii = *i;
    size_t numnl_following = count_following_newlines(r, &ii, indentation);
    if(numnl_following)
    {
        _c4dbgfnl("{} consecutive (empty) lines {} in the middle. totalws={}", 1+numnl_following, ii < r.len ? "in the middle" : "at the end", ii - *i);
        for(size_t j = 0; j < numnl_following; ++j)
            m_filter_arena.str[(*pos)++] = '\n';
    }
    else
    {
        if(r.first_not_of(" \t", *i+1) != npos)
        {
            m_filter_arena.str[(*pos)++] = ' ';
            _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
            replaced = true;
        }
        else
        {
            if C4_IF_CONSTEXPR (keep_trailing_whitespace)
            {
                m_filter_arena.str[(*pos)++] = ' ';
                _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
                replaced = true;
            }
            else
            {
                _c4dbgfnl("last newline, everything else is whitespace. ii={}/{}", ii, r.len);
                *i = r.len;
            }
        }
        if C4_IF_CONSTEXPR (backslash_is_escape)
        {
            if(ii < r.len && r.str[ii] == '\\')
            {
                const char next = ii+1 < r.len ? r.str[ii+1] : '\0';
                if(next == ' ' || next == '\t')
                {
                    _c4dbgfnl("extend skip to backslash{}", "");
                    ++ii;
                }
            }
        }
    }
    *i = ii - 1; // correct for the loop increment

    #undef _c4dbgfnl

    return replaced;
}